

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_global_encodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  int iVar1;
  void *pvVar3;
  long lVar4;
  int iVar5;
  char *fmt;
  ulong uVar6;
  uint uVar7;
  uint c;
  JSValue v;
  JSValue v_00;
  JSValue JVar8;
  StringBuffer b_s;
  int64_t local_70;
  StringBuffer local_50;
  JSValueUnion JVar2;
  
  JVar8 = JS_ToStringInternal(ctx,*argv,0);
  local_70 = JVar8.tag;
  JVar2 = JVar8.u;
  if ((int)JVar8.tag != 6) {
    local_50.size = *(uint *)((long)JVar2.ptr + 4) & 0x7fffffff;
    local_50.len = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,local_50.size,0);
    if (local_50.str == (JSString *)0x0) {
      local_50.size = 0;
      local_50.error_status = -1;
    }
    uVar6 = *(ulong *)((long)JVar2.ptr + 4);
    uVar7 = (uint)uVar6 & 0x7fffffff;
    if ((uVar6 & 0x7fffffff) != 0) {
      iVar5 = 0;
      do {
        local_70 = JVar8.tag;
        lVar4 = (long)iVar5;
        if ((int)uVar6 < 0) {
          c = (uint)*(ushort *)((long)JVar8.u.ptr + lVar4 * 2 + 0x10);
        }
        else {
          c = (uint)*(byte *)((long)JVar8.u.ptr + lVar4 + 0x10);
        }
        iVar1 = iVar5 + 1;
        if ((c < 0x100) &&
           ((((c - 0x30 < 10 || ((c & 0xdf) - 0x41 < 0x1a)) ||
             (pvVar3 = memchr("-_.!~*\'()",c,9), pvVar3 != (void *)0x0)) ||
            ((isComponent == 0 && (pvVar3 = memchr(";/?:@&=+$,#",c,0xb), pvVar3 != (void *)0x0))))))
        {
          string_buffer_putc16(&local_50,c);
          iVar5 = iVar1;
        }
        else {
          if ((c & 0xfc00) == 0xd800) {
            if (iVar1 < (int)uVar7) {
              if ((int)uVar6 < 0) {
                uVar7 = (uint)*(ushort *)((long)JVar2.ptr + lVar4 * 2 + 0x12);
              }
              else {
                uVar7 = (uint)*(byte *)((long)JVar2.ptr + lVar4 + 0x11);
              }
              if (0xfffffbff < uVar7 - 0xe000) {
                iVar5 = iVar5 + 2;
                c = (c & 0x3ff) * 0x400 + (uVar7 & 0x3ff) + 0x10000;
                goto LAB_001695bc;
              }
            }
            fmt = "expecting surrogate pair";
LAB_001696f2:
            js_throw_URIError(ctx,fmt);
            if ((0xfffffff4 < (uint)JVar8.tag) &&
               (iVar5 = *JVar2.ptr, *(int *)JVar2.ptr = iVar5 + -1, iVar5 < 2)) {
              v_00.tag = local_70;
              v_00.u.ptr = JVar2.ptr;
              __JS_FreeValueRT(ctx->rt,v_00);
            }
            (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
            return (JSValue)(ZEXT816(6) << 0x40);
          }
          iVar5 = iVar1;
          if ((c & 0xfc00) == 0xdc00) {
            fmt = "invalid character";
            goto LAB_001696f2;
          }
LAB_001695bc:
          if (0x7f < c) {
            if (c < 0x800) {
              uVar7 = c >> 6 | 0xc0;
            }
            else {
              if (c < 0x10000) {
                uVar7 = c >> 0xc | 0xe0;
              }
              else {
                encodeURI_hex(&local_50,c >> 0x12 | 0xf0);
                uVar7 = c >> 0xc & 0x3f | 0x80;
              }
              encodeURI_hex(&local_50,uVar7);
              uVar7 = c >> 6 & 0x3f | 0x80;
            }
            encodeURI_hex(&local_50,uVar7);
            c = c & 0x3f | 0x80;
          }
          encodeURI_hex(&local_50,c);
        }
        JVar8.tag = local_70;
        JVar8.u.ptr = JVar2.ptr;
        uVar6 = *(ulong *)((long)JVar2.ptr + 4);
        uVar7 = (uint)uVar6 & 0x7fffffff;
      } while (iVar5 < (int)uVar7);
    }
    if ((0xfffffff4 < (uint)local_70) &&
       (iVar5 = *JVar2.ptr, *(int *)JVar2.ptr = iVar5 + -1, iVar5 < 2)) {
      v.tag = local_70;
      v.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    JVar8 = string_buffer_end(&local_50);
  }
  return JVar8;
}

Assistant:

static JSValue js_global_encodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        k++;
        if (isURIUnescaped(c, isComponent)) {
            string_buffer_putc16(b, c);
        } else {
            if (c >= 0xdc00 && c <= 0xdfff) {
                js_throw_URIError(ctx, "invalid character");
                goto fail;
            } else if (c >= 0xd800 && c <= 0xdbff) {
                if (k >= p->len) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c1 = string_get(p, k);
                k++;
                if (c1 < 0xdc00 || c1 > 0xdfff) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
            }
            if (c < 0x80) {
                encodeURI_hex(b, c);
            } else {
                /* XXX: use C UTF-8 conversion ? */
                if (c < 0x800) {
                    encodeURI_hex(b, (c >> 6) | 0xc0);
                } else {
                    if (c < 0x10000) {
                        encodeURI_hex(b, (c >> 12) | 0xe0);
                    } else {
                        encodeURI_hex(b, (c >> 18) | 0xf0);
                        encodeURI_hex(b, ((c >> 12) & 0x3f) | 0x80);
                    }
                    encodeURI_hex(b, ((c >> 6) & 0x3f) | 0x80);
                }
                encodeURI_hex(b, (c & 0x3f) | 0x80);
            }
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}